

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O2

uint Assimp::StandardShapes::MakeOctahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  value_type local_90;
  value_type local_80;
  value_type local_70;
  value_type local_60;
  value_type local_50;
  value_type local_40;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,
             ((long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0xc + 0x18);
  local_80.x = 1.0;
  local_80.y = 0.0;
  local_80.z = 0.0;
  local_40.x = -1.0;
  local_40.y = 0.0;
  local_40.z = 0.0;
  local_50.x = 0.0;
  local_50.y = 1.0;
  local_50.z = 0.0;
  local_90.x = 0.0;
  local_90.y = -1.0;
  local_90.z = 0.0;
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_60.z = 1.0;
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_70.z = -1.0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_60);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_80);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_60);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_40);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_60);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_40);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_90);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_60);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_90);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_80);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_70);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_80);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_70);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_40);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_70);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_90);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_40);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_70);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_80);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_90);
  return 3;
}

Assistant:

unsigned int StandardShapes::MakeOctahedron(std::vector<aiVector3D>& positions)
{
    positions.reserve(positions.size()+24);

    const aiVector3D v0  = aiVector3D(1.0, 0.0, 0.0) ;
    const aiVector3D v1  = aiVector3D(-1.0, 0.0, 0.0);
    const aiVector3D v2  = aiVector3D(0.0, 1.0, 0.0);
    const aiVector3D v3  = aiVector3D(0.0, -1.0, 0.0);
    const aiVector3D v4  = aiVector3D(0.0, 0.0, 1.0);
    const aiVector3D v5  = aiVector3D(0.0, 0.0, -1.0);

    ADD_TRIANGLE(v4,v0,v2);
    ADD_TRIANGLE(v4,v2,v1);
    ADD_TRIANGLE(v4,v1,v3);
    ADD_TRIANGLE(v4,v3,v0);

    ADD_TRIANGLE(v5,v2,v0);
    ADD_TRIANGLE(v5,v1,v2);
    ADD_TRIANGLE(v5,v3,v1);
    ADD_TRIANGLE(v5,v0,v3);
    return 3;
}